

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

void __thiscall
glu::SubTypeIterator<glu::IsBasicType>::removeTraversed(SubTypeIterator<glu::IsBasicType> *this)

{
  int iVar1;
  VarType *this_00;
  bool bVar2;
  DataType DVar3;
  int iVar4;
  StructType *this_01;
  __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  in_R8;
  int local_58;
  __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  local_48;
  VarTypeComponent *local_40;
  VarType *local_38;
  undefined1 local_30 [8];
  VarType parentType;
  VarTypeComponent *curComp;
  SubTypeIterator<glu::IsBasicType> *this_local;
  
  do {
    bVar2 = std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::empty
                      (&this->m_path);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    parentType.m_data._8_8_ =
         std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::back
                   (&this->m_path);
    this_00 = this->m_type;
    local_38 = (VarType *)
               std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::begin
                         (&this->m_path);
    local_48._M_current =
         (VarTypeComponent *)
         std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::end
                   (&this->m_path);
    local_40 = (VarTypeComponent *)
               __gnu_cxx::
               __normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
               ::operator-(&local_48,1);
    getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
              ((VarType *)local_30,(glu *)this_00,local_38,
               (__normal_iterator<glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                )local_40,in_R8);
    if (*(int *)parentType.m_data._8_8_ == 2) {
      iVar1 = *(int *)(parentType.m_data._8_8_ + 4);
      DVar3 = glu::VarType::getBasicType((VarType *)local_30);
      iVar4 = getDataTypeMatrixNumColumns(DVar3);
      if (iVar4 <= iVar1 + 1) goto LAB_02099fa5;
      local_58 = 3;
    }
    else {
      if (*(int *)parentType.m_data._8_8_ == 3) {
        iVar1 = *(int *)(parentType.m_data._8_8_ + 4);
        DVar3 = glu::VarType::getBasicType((VarType *)local_30);
        iVar4 = getDataTypeScalarSize(DVar3);
        if (iVar1 + 1 < iVar4) {
          local_58 = 3;
          goto LAB_02099fb9;
        }
      }
      else if (*(int *)parentType.m_data._8_8_ == 1) {
        iVar1 = *(int *)(parentType.m_data._8_8_ + 4);
        iVar4 = glu::VarType::getArraySize((VarType *)local_30);
        if (iVar1 + 1 < iVar4) {
          local_58 = 3;
          goto LAB_02099fb9;
        }
      }
      else if (*(int *)parentType.m_data._8_8_ == 0) {
        iVar1 = *(int *)(parentType.m_data._8_8_ + 4);
        this_01 = glu::VarType::getStructPtr((VarType *)local_30);
        iVar4 = StructType::getNumMembers(this_01);
        if (iVar1 + 1 < iVar4) {
          local_58 = 3;
          goto LAB_02099fb9;
        }
      }
LAB_02099fa5:
      std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::pop_back
                (&this->m_path);
      local_58 = 0;
    }
LAB_02099fb9:
    glu::VarType::~VarType((VarType *)local_30);
    if (local_58 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void SubTypeIterator<IsExpanded>::removeTraversed (void)
{
	DE_ASSERT(m_type && !m_path.empty());

	// Pop traversed nodes.
	while (!m_path.empty())
	{
		VarTypeComponent&	curComp		= m_path.back();
		VarType				parentType	= getVarType(*m_type, m_path.begin(), m_path.end()-1);

		if (curComp.type == VarTypeComponent::MATRIX_COLUMN)
		{
			DE_ASSERT(isDataTypeMatrix(parentType.getBasicType()));
			if (curComp.index+1 < getDataTypeMatrixNumColumns(parentType.getBasicType()))
				break;
		}
		else if (curComp.type == VarTypeComponent::VECTOR_COMPONENT)
		{
			DE_ASSERT(isDataTypeVector(parentType.getBasicType()));
			if (curComp.index+1 < getDataTypeScalarSize(parentType.getBasicType()))
				break;
		}
		else if (curComp.type == VarTypeComponent::ARRAY_ELEMENT)
		{
			DE_ASSERT(parentType.isArrayType());
			if (curComp.index+1 < parentType.getArraySize())
				break;
		}
		else if (curComp.type == VarTypeComponent::STRUCT_MEMBER)
		{
			DE_ASSERT(parentType.isStructType());
			if (curComp.index+1 < parentType.getStructPtr()->getNumMembers())
				break;
		}

		m_path.pop_back();
	}
}